

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

ENetSocket enet_socket_accept(ENetSocket socket,ENetAddress *address)

{
  uint16_t uVar1;
  char *in_RSI;
  int in_EDI;
  socklen_t sinLength;
  sockaddr_in sin;
  int result;
  socklen_t *local_48;
  sockaddr *local_38;
  socklen_t local_28;
  sockaddr local_24;
  int local_14;
  char *local_10;
  int local_4;
  
  local_28 = 0x10;
  if (in_RSI == (char *)0x0) {
    local_38 = (sockaddr *)0x0;
    local_48 = (socklen_t *)0x0;
  }
  else {
    local_38 = &local_24;
    local_48 = &local_28;
  }
  local_10 = in_RSI;
  local_14 = accept(in_EDI,local_38,local_48);
  if (local_14 == -1) {
    local_4 = -1;
  }
  else {
    if (local_10 != (char *)0x0) {
      *(undefined4 *)local_10 = local_24.sa_data._2_4_;
      uVar1 = ntohs(local_24.sa_data._0_2_);
      *(uint16_t *)(local_10 + 4) = uVar1;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

ENetSocket
enet_socket_accept (ENetSocket socket, ENetAddress * address)
{
    int result;
    struct sockaddr_in sin;
    socklen_t sinLength = sizeof (struct sockaddr_in);

    result = accept (socket, 
                     address != NULL ? (struct sockaddr *) & sin : NULL, 
                     address != NULL ? & sinLength : NULL);
    
    if (result == -1)
      return ENET_SOCKET_NULL;

    if (address != NULL)
    {
        address -> host = (enet_uint32) sin.sin_addr.s_addr;
        address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);
    }

    return result;
}